

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O2

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
                mrg_parameter<int,_4,_trng::mrg4> *P)

{
  undefined4 uVar1;
  long lVar2;
  mrg_parameter<int,_4,_trng::mrg4> P_new;
  delim_c local_39;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_39.c = '(';
  utility::operator>>(in,&local_39);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    std::wistream::operator>>((wistream *)in,(int *)((long)&local_38 + lVar2));
    if (lVar2 != 0xc) {
      local_39.c = ' ';
      utility::operator>>(in,&local_39);
    }
  }
  local_39.c = ')';
  utility::operator>>(in,&local_39);
  lVar2 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar2 + 0x20] & 5) == 0) {
    *(undefined8 *)P->a = local_38;
    *(undefined8 *)(P->a + 2) = uStack_30;
    lVar2 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar2 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_parameter &P) {
      mrg_parameter P_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> P_new.a[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        P = P_new;
      in.flags(flags);
      return in;
    }